

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpAggregator.cpp
# Opt level: O0

void __thiscall
HighsLpAggregator::getCurrentAggregation
          (HighsLpAggregator *this,vector<int,_std::allocator<int>_> *inds,
          vector<double,_std::allocator<double>_> *vals,bool negate)

{
  HighsSparseVectorSum *this_00;
  int iVar1;
  HighsMipSolver *pHVar2;
  size_type sVar3;
  reference pvVar4;
  HighsInt index;
  byte in_CL;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 *in_RDI;
  double dVar5;
  vector<int,_std::allocator<int>_> *in_stack_00000028;
  HighsInt i_1;
  HighsInt i;
  HighsInt len;
  HighsInt numCol;
  double droptol;
  undefined8 in_stack_ffffffffffffff88;
  HighsSparseVectorSum *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffbc;
  
  pHVar2 = HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
  this_00 = (HighsSparseVectorSum *)
            (pHVar2->options_mip_->super_HighsOptionsStruct).small_matrix_value;
  HighsLpRelaxation::numCols((HighsLpRelaxation *)0x601e8f);
  HighsSparseVectorSum::
  cleanup<HighsLpAggregator::getCurrentAggregation(std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,bool)::__0>
            (this_00,(anon_class_16_2_70b8718f *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  HighsSparseVectorSum::getNonzeros((HighsSparseVectorSum *)(in_RDI + 1));
  std::vector<int,_std::allocator<int>_>::operator=(_i,in_stack_00000028);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  iVar1 = (int)sVar3;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_type)in_RDI);
  if ((in_CL & 1) == 0) {
    for (iVar6 = 0; iVar6 != iVar1; iVar6 = iVar6 + 1) {
      index = (HighsInt)((ulong)(in_RDI + 1) >> 0x20);
      std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar6);
      in_stack_ffffffffffffff90 =
           (HighsSparseVectorSum *)HighsSparseVectorSum::getValue(in_stack_ffffffffffffff90,index);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)iVar6);
      *pvVar4 = (value_type)in_stack_ffffffffffffff90;
    }
  }
  else {
    for (iVar6 = 0; iVar6 != iVar1; iVar6 = iVar6 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar6);
      dVar5 = HighsSparseVectorSum::getValue
                        (in_stack_ffffffffffffff90,
                         (HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)iVar6);
      *pvVar4 = -dVar5;
    }
  }
  return;
}

Assistant:

void HighsLpAggregator::getCurrentAggregation(std::vector<HighsInt>& inds,
                                              std::vector<double>& vals,
                                              bool negate) {
  const double droptol =
      lprelaxation.getMipSolver().options_mip_->small_matrix_value;
  const HighsInt numCol = lprelaxation.numCols();
  vectorsum.cleanup([droptol, numCol](HighsInt col, double val) {
    // only drop values for columns and not for slack variables of rows as the
    // former are the only ones which might be subject to numerical error. The
    // values for row slack variables are exact copies of the weights used
    // (assuming that separators only add each row once). Also all the
    // separators will only allow rows that do have meaningful coefficient
    // contributions with the used weight
    return col < numCol && std::fabs(val) <= droptol;
  });

  inds = vectorsum.getNonzeros();
  HighsInt len = inds.size();
  vals.resize(len);

  if (negate)
    for (HighsInt i = 0; i != len; ++i) vals[i] = -vectorsum.getValue(inds[i]);
  else
    for (HighsInt i = 0; i != len; ++i) vals[i] = vectorsum.getValue(inds[i]);
}